

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O3

string * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
::vertices_to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
          *this)

{
  Graph_vertex *pGVar1;
  ulong uVar2;
  ulong uVar3;
  integer_iterator<unsigned_long> iVar4;
  ostringstream stream;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  local_1d8;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  ::Vertex_iterator(&local_1d8,
                    (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                     *)this);
  uVar2 = (*(long *)(this + 0x58) - *(long *)(this + 0x50) >> 3) * 0x2e8ba2e8ba2e8ba3;
  local_1c0 = this;
  local_1b8 = uVar2;
  local_1b0 = uVar2;
  if ((local_1d8.vertexIterator.first.m_value != uVar2 ||
      (local_1d8.vertexIterator.second.m_value ^ uVar2) != 0) ||
      ((ulong)local_1d8.complex ^ (ulong)this) != 0) {
    iVar4.m_value = local_1d8.vertexIterator.first.m_value;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
      pGVar1 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
               ::operator[]((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                             *)this,(Vertex_handle)(boost_vertex_handle)iVar4.m_value);
      std::ostream::operator<<((ostream *)local_1a8,(pGVar1->super_Simple_vertex).id_.vertex);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"} ",2);
      uVar3 = iVar4.m_value;
      do {
        uVar3 = uVar3 + 1;
        iVar4.m_value = local_1d8.vertexIterator.second.m_value;
        if (local_1d8.vertexIterator.second.m_value == uVar3) break;
        pGVar1 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                 ::operator[](local_1d8.complex,(Vertex_handle)(boost_vertex_handle)uVar3);
        iVar4.m_value = uVar3;
      } while ((pGVar1->super_Simple_vertex).is_active_ != true);
    } while ((iVar4.m_value != uVar2 || (local_1d8.vertexIterator.second.m_value ^ uVar2) != 0) ||
             ((ulong)local_1d8.complex ^ (ulong)this) != 0);
  }
  std::ios::widen((char)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string vertices_to_string() const {
    std::ostringstream stream;
    for (auto vertex : vertex_range()) {
      stream << "{" << (*this)[vertex].get_id() << "} ";
    }
    stream << std::endl;
    return stream.str();
  }